

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O2

void __thiscall
cmSourceFileLocation::cmSourceFileLocation(cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  this->Makefile = loc->Makefile;
  (this->Directory)._M_dataplus._M_p = (pointer)&(this->Directory).field_2;
  (this->Directory)._M_string_length = 0;
  (this->Directory).field_2._M_local_buf[0] = '\0';
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  this->AmbiguousDirectory = loc->AmbiguousDirectory;
  this->AmbiguousExtension = loc->AmbiguousExtension;
  std::__cxx11::string::_M_assign((string *)&this->Directory);
  std::__cxx11::string::_M_assign((string *)&this->Name);
  return;
}

Assistant:

cmSourceFileLocation::cmSourceFileLocation(const cmSourceFileLocation& loc)
  : Makefile(loc.Makefile)
{
  this->AmbiguousDirectory = loc.AmbiguousDirectory;
  this->AmbiguousExtension = loc.AmbiguousExtension;
  this->Directory = loc.Directory;
  this->Name = loc.Name;
}